

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

void * memset(void *__s,int __c,size_t __n)

{
  size_t i;
  size_t sVar1;
  uchar *s_;
  
  for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
    *(char *)((long)__s + sVar1) = (char)__c;
  }
  return __s;
}

Assistant:

void *memset(void *s, int c, size_t n) {
    unsigned char *s_ = s;
    const unsigned char c_ = (unsigned char)c;
    for (size_t i = 0; i < n; ++i) {
        s_[i] = c_;
    }
    return s;
}